

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

void __thiscall Translator::visit(Translator *this,ProgramNode *programNode)

{
  if (programNode->varlist != (VarDeclNode *)0x0) {
    visit(this,programNode->varlist);
  }
  if (programNode->functions != (FunctionListNode *)0x0) {
    visit(this,programNode->functions);
    return;
  }
  return;
}

Assistant:

void Translator::visit(ProgramNode *programNode) {
    if (programNode->getVarList() != nullptr) {
        programNode->getVarList()->accept(this);
    }
    if (programNode->getTypeList() != nullptr) {
        programNode->getTypeList()->accept(this);
    }
    if (programNode->getFunctions() != nullptr) {
        programNode->getFunctions()->accept(this);
    }
}